

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<siginfo_t> * __thiscall
kj::_::ExceptionOr<siginfo_t>::operator=
          (ExceptionOr<siginfo_t> *this,ExceptionOr<siginfo_t> *param_1)

{
  long lVar1;
  anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *paVar2;
  anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *paVar3;
  byte bVar4;
  
  bVar4 = 0;
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
    }
    if ((param_1->value).ptr.isSet == true) {
      paVar2 = &(param_1->value).ptr.field_1;
      paVar3 = &(this->value).ptr.field_1;
      for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
        *(undefined8 *)paVar3 = *(undefined8 *)paVar2;
        paVar2 = (anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *)
                 ((long)paVar2 + (ulong)bVar4 * -0x10 + 8);
        paVar3 = (anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *)
                 ((long)paVar3 + (ulong)bVar4 * -0x10 + 8);
      }
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;